

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory_Banks.c
# Opt level: O0

uint8_t gb_common_reads(MemoryBankController *mc,uint16_t address)

{
  uint8_t uVar1;
  uint16_t address_local;
  MemoryBankController *mc_local;
  
  if (address == 0xff00) {
    uVar1 = gb_read_joypad_input(mc);
    return uVar1;
  }
  if (address != 0xff01) {
    if (address == 0xff0f) {
      return mc->memory[0xff0f] | 0xe0;
    }
    if ((((address != 0xff18) && (address != 0xff1b)) && (address != 0xff1d)) && (address != 0xff20)
       ) {
      return mc->memory[address];
    }
  }
  return 0xff;
}

Assistant:

uint8_t gb_common_reads(MemoryBankController* mc, uint16_t address) {

    switch (address) {
    case JOYP:
        return gb_read_joypad_input(mc);
    case IF:
        return mc->memory[address] | 0xE0;
    case 0xFF01: case 0xFF18: case 0xFF1B:
    case 0xFF1D: case 0xFF20:
        return 0xFF;
    default:
        return mc->memory[address];
    }
}